

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest4::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest4 *this,_shader_stage *shader_stage,
          uint *n_subroutine_types,_test_case *test_case)

{
  uint uVar1;
  ostream *poVar2;
  TestError *this_00;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  stringstream result_sstream;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\n",0x3d);
  uVar1 = *shader_stage - SHADER_STAGE_TESSELLATION_CONTROL;
  if (uVar1 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,&DAT_01a605c4 + *(int *)(&DAT_01a605c4 + (ulong)uVar1 * 4),
               *(long *)(&DAT_01a605d0 + (ulong)uVar1 * 8));
  }
  if (*n_subroutine_types != 1) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"subroutine void subroutineType",0x1e);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(inout vec3 argument);\n",0x17);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *n_subroutine_types - 1);
  }
  if (*test_case == TEST_CASE_FIRST) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"subroutine int subroutineType",0x1d);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    lVar3 = 0x17;
    pcVar5 = "(inout vec3 argument);\n";
  }
  else {
    if (*test_case != TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized test case",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2e3b);
      goto LAB_00989952;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"subroutine void subroutineType",0x1e);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    lVar3 = 0x2b;
    pcVar5 = "(inout vec3 argument, out vec4 argument2);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"subroutine(",0xb);
  if (*n_subroutine_types != 0) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"subroutineType",0xe);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      uVar1 = *n_subroutine_types;
      if (uVar4 != uVar1 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        uVar1 = *n_subroutine_types;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             ") void function(inout vec3 argument)\n{\n    argument = vec3(1, 2, 3);\n}\n\n",0x48);
  uVar4 = (ulong)*shader_stage;
  if (uVar4 < 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,&DAT_01a605e8 + *(int *)(&DAT_01a605e8 + uVar4 * 4),
               *(long *)(&DAT_01a60600 + uVar4 * 8));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader stage",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x2e89);
LAB_00989952:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string NegativeTest4::getShaderBody(const Utils::_shader_stage& shader_stage,
										 const unsigned int& n_subroutine_types, const _test_case& test_case) const
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n";

	/* Inject stage-specific code */
	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "layout (points) in;\n"
						  "layout (points, max_vertices = 1) out;\n"
						  "\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "layout (vertices = 4) out;\n"
						  "\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	{
		result_sstream << "layout (quads) in;\n"
						  "\n";

		break;
	}

	default:
		break;
	} /* switch (shader_stage) */

	/* Insert subroutine type declarations */
	for (unsigned int n_subroutine_type = 0; n_subroutine_type < n_subroutine_types - 1; ++n_subroutine_type)
	{
		result_sstream << "subroutine void subroutineType" << n_subroutine_type << "(inout vec3 argument);\n";
	} /* for (all subroutine types) */

	switch (test_case)
	{
	case TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST:
	{
		result_sstream << "subroutine void subroutineType" << (n_subroutine_types - 1)
					   << "(inout vec3 argument, out vec4 argument2);\n";

		break;
	}

	case TEST_CASE_INCOMPATIBLE_RETURN_TYPE:
	{
		result_sstream << "subroutine int subroutineType" << (n_subroutine_types - 1) << "(inout vec3 argument);\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized test case");
	}
	} /* switch (test_case) */

	/* Insert subroutine declarations */
	result_sstream << "subroutine(";

	for (unsigned int n_subroutine_type = 0; n_subroutine_type < n_subroutine_types; ++n_subroutine_type)
	{
		result_sstream << "subroutineType" << n_subroutine_type;

		if (n_subroutine_type != (n_subroutine_types - 1))
		{
			result_sstream << ", ";
		}
	} /* for (all subroutine types) */

	result_sstream << ") void function(inout vec3 argument)\n"
					  "{\n"
					  "    argument = vec3(1, 2, 3);\n"
					  "}\n"
					  "\n";

	/* Insert remaining required stage-specific bits */
	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_FRAGMENT:
	{
		result_sstream << "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1, 2, 3, 4);\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1, 2, 3, 4);\n"
						  "    EmitVertex();\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_TessLevelInner[0]                = 1;\n"
						  "    gl_TessLevelInner[1]                = 1;\n"
						  "    gl_TessLevelOuter[0]                = 1;\n"
						  "    gl_TessLevelOuter[1]                = 1;\n"
						  "    gl_TessLevelOuter[2]                = 1;\n"
						  "    gl_TessLevelOuter[3]                = 1;\n"
						  "    gl_out[gl_InvocationID].gl_Position = vec4(2, 3, 4, 5);\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	case Utils::SHADER_STAGE_VERTEX:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1, 2, 3, 4);\n"
						  "}\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized shader stage");
	}
	} /* switch (shader_stage) */

	return result_sstream.str();
}